

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void opj_idwt53_v(opj_dwt_t *dwt,OPJ_INT32 *tiledp_col,OPJ_SIZE_T stride,OPJ_INT32 nb_cols)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  uint uVar8;
  int iVar10;
  OPJ_INT32 *pOVar11;
  ulong uVar12;
  int iVar13;
  int *piVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  OPJ_INT32 *pOVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  ulong uVar9;
  
  iVar19 = dwt->sn;
  lVar22 = (long)iVar19;
  uVar8 = dwt->dn + iVar19;
  uVar9 = (ulong)uVar8;
  if (dwt->cas == 0) {
    if (nb_cols == 8 && 1 < (int)uVar8) {
      pOVar21 = dwt->mem;
      if (((ulong)pOVar21 & 0xf) != 0) {
        __assert_fail("(OPJ_SIZE_T)tmp % (sizeof(OPJ_INT32) * VREG_INT_COUNT) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/dwt.c"
                      ,0x29d,
                      "void opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2(OPJ_INT32 *, const OPJ_INT32, const OPJ_INT32, OPJ_INT32 *, const OPJ_SIZE_T)"
                     );
      }
      piVar14 = tiledp_col + lVar22 * stride;
      iVar19 = *piVar14;
      iVar13 = piVar14[1];
      iVar6 = piVar14[2];
      iVar18 = piVar14[3];
      piVar14 = tiledp_col + lVar22 * stride + 4;
      iVar5 = *piVar14;
      iVar10 = piVar14[1];
      iVar17 = piVar14[2];
      iVar32 = piVar14[3];
      iVar29 = *tiledp_col - (iVar19 * 2 + 2 >> 2);
      iVar30 = tiledp_col[1] - (iVar13 * 2 + 2 >> 2);
      iVar31 = tiledp_col[2] - (iVar6 * 2 + 2 >> 2);
      iVar33 = tiledp_col[3] - (iVar18 * 2 + 2 >> 2);
      iVar41 = tiledp_col[4] - (iVar5 * 2 + 2 >> 2);
      iVar42 = tiledp_col[5] - (iVar10 * 2 + 2 >> 2);
      iVar43 = tiledp_col[6] - (iVar17 * 2 + 2 >> 2);
      iVar28 = tiledp_col[7] - (iVar32 * 2 + 2 >> 2);
      if ((int)uVar8 < 4) {
        uVar15 = 0;
      }
      else {
        lVar22 = (lVar22 * 4 + 4) * stride;
        lVar16 = 4;
        uVar15 = 0;
        iVar35 = iVar19;
        iVar37 = iVar13;
        iVar39 = iVar6;
        iVar44 = iVar18;
        iVar45 = iVar5;
        iVar46 = iVar10;
        iVar47 = iVar17;
        iVar48 = iVar32;
        iVar24 = iVar41;
        iVar25 = iVar42;
        iVar26 = iVar43;
        iVar27 = iVar28;
        iVar34 = iVar29;
        iVar36 = iVar30;
        iVar38 = iVar31;
        iVar40 = iVar33;
        do {
          piVar1 = tiledp_col + stride + lVar16 + -4;
          piVar14 = tiledp_col + stride + lVar16;
          piVar7 = (int *)((long)tiledp_col + lVar16 * 4 + lVar22 + -0x10);
          iVar19 = *piVar7;
          iVar13 = piVar7[1];
          iVar6 = piVar7[2];
          iVar18 = piVar7[3];
          piVar7 = (int *)((long)tiledp_col + lVar16 * 4 + lVar22);
          iVar5 = *piVar7;
          iVar10 = piVar7[1];
          iVar17 = piVar7[2];
          iVar32 = piVar7[3];
          iVar29 = *piVar1 - (iVar35 + iVar19 + 2 >> 2);
          iVar30 = piVar1[1] - (iVar37 + iVar13 + 2 >> 2);
          iVar31 = piVar1[2] - (iVar39 + iVar6 + 2 >> 2);
          iVar33 = piVar1[3] - (iVar44 + iVar18 + 2 >> 2);
          iVar41 = *piVar14 - (iVar45 + iVar5 + 2 >> 2);
          iVar42 = piVar14[1] - (iVar46 + iVar10 + 2 >> 2);
          iVar43 = piVar14[2] - (iVar47 + iVar17 + 2 >> 2);
          iVar28 = piVar14[3] - (iVar48 + iVar32 + 2 >> 2);
          pOVar11 = pOVar21 + uVar15;
          *pOVar11 = iVar34;
          pOVar11[1] = iVar36;
          pOVar11[2] = iVar38;
          pOVar11[3] = iVar40;
          pOVar11 = pOVar21 + uVar15 + 4;
          *pOVar11 = iVar24;
          pOVar11[1] = iVar25;
          pOVar11[2] = iVar26;
          pOVar11[3] = iVar27;
          pOVar11 = pOVar21 + uVar15 + 8;
          *pOVar11 = (iVar34 + iVar29 >> 1) + iVar35;
          pOVar11[1] = (iVar36 + iVar30 >> 1) + iVar37;
          pOVar11[2] = (iVar38 + iVar31 >> 1) + iVar39;
          pOVar11[3] = (iVar40 + iVar33 >> 1) + iVar44;
          pOVar11 = pOVar21 + uVar15 + 0xc;
          *pOVar11 = (iVar24 + iVar41 >> 1) + iVar45;
          pOVar11[1] = (iVar25 + iVar42 >> 1) + iVar46;
          pOVar11[2] = (iVar26 + iVar43 >> 1) + iVar47;
          pOVar11[3] = (iVar27 + iVar28 >> 1) + iVar48;
          uVar15 = uVar15 + 0x10;
          lVar16 = lVar16 + stride;
          iVar35 = iVar19;
          iVar37 = iVar13;
          iVar39 = iVar6;
          iVar44 = iVar18;
          iVar45 = iVar5;
          iVar46 = iVar10;
          iVar47 = iVar17;
          iVar48 = iVar32;
          iVar24 = iVar41;
          iVar25 = iVar42;
          iVar26 = iVar43;
          iVar27 = iVar28;
          iVar34 = iVar29;
          iVar36 = iVar30;
          iVar38 = iVar31;
          iVar40 = iVar33;
        } while ((ulong)(uVar8 - 4 >> 1) * 0x10 + 0x10 != uVar15);
        uVar15 = uVar15 & 0xffffffff;
      }
      pOVar11 = pOVar21 + uVar15;
      *pOVar11 = iVar29;
      pOVar11[1] = iVar30;
      pOVar11[2] = iVar31;
      pOVar11[3] = iVar33;
      pOVar11 = pOVar21 + uVar15 + 4;
      *pOVar11 = iVar41;
      pOVar11[1] = iVar42;
      pOVar11[2] = iVar43;
      pOVar11[3] = iVar28;
      if ((uVar8 & 1) == 0) {
        uVar15 = (ulong)(uVar8 * 8 - 8);
        pOVar11 = pOVar21 + uVar15;
        *pOVar11 = iVar29 + iVar19;
        pOVar11[1] = iVar30 + iVar13;
        pOVar11[2] = iVar31 + iVar6;
        pOVar11[3] = iVar33 + iVar18;
        pOVar11 = pOVar21 + uVar15 + 4;
        *pOVar11 = iVar41 + iVar5;
        pOVar11[1] = iVar42 + iVar10;
        pOVar11[2] = iVar43 + iVar17;
        pOVar11[3] = iVar28 + iVar32;
      }
      else {
        lVar22 = (uVar8 - 1 >> 1) * stride;
        piVar14 = tiledp_col + lVar22;
        iVar35 = *piVar14 - (iVar19 * 2 + 2 >> 2);
        iVar37 = piVar14[1] - (iVar13 * 2 + 2 >> 2);
        iVar39 = piVar14[2] - (iVar6 * 2 + 2 >> 2);
        iVar44 = piVar14[3] - (iVar18 * 2 + 2 >> 2);
        uVar15 = (ulong)(uVar8 * 8 - 8);
        pOVar11 = pOVar21 + uVar15;
        *pOVar11 = iVar35;
        pOVar11[1] = iVar37;
        pOVar11[2] = iVar39;
        pOVar11[3] = iVar44;
        uVar12 = (ulong)(uVar8 * 8 - 0x10);
        pOVar11 = pOVar21 + uVar12;
        *pOVar11 = (iVar35 + iVar29 >> 1) + iVar19;
        pOVar11[1] = (iVar37 + iVar30 >> 1) + iVar13;
        pOVar11[2] = (iVar39 + iVar31 >> 1) + iVar6;
        pOVar11[3] = (iVar44 + iVar33 >> 1) + iVar18;
        piVar14 = tiledp_col + lVar22 + 4;
        iVar19 = *piVar14 - (iVar5 * 2 + 2 >> 2);
        iVar13 = piVar14[1] - (iVar10 * 2 + 2 >> 2);
        iVar6 = piVar14[2] - (iVar17 * 2 + 2 >> 2);
        iVar18 = piVar14[3] - (iVar32 * 2 + 2 >> 2);
        pOVar11 = pOVar21 + uVar15 + 4;
        *pOVar11 = iVar19;
        pOVar11[1] = iVar13;
        pOVar11[2] = iVar6;
        pOVar11[3] = iVar18;
        pOVar11 = pOVar21 + uVar12 + 4;
        *pOVar11 = (iVar19 + iVar41 >> 1) + iVar5;
        pOVar11[1] = (iVar13 + iVar42 >> 1) + iVar10;
        pOVar11[2] = (iVar6 + iVar43 >> 1) + iVar17;
        pOVar11[3] = (iVar18 + iVar28 >> 1) + iVar32;
      }
      if (0 < (int)uVar8) {
        pOVar11 = tiledp_col + 4;
        lVar22 = 0;
        do {
          uVar3 = ((undefined8 *)((long)pOVar21 + lVar22))[1];
          *(undefined8 *)(pOVar11 + -4) = *(undefined8 *)((long)pOVar21 + lVar22);
          *(undefined8 *)(pOVar11 + -2) = uVar3;
          puVar2 = (undefined8 *)((long)pOVar21 + lVar22 + 0x10);
          uVar3 = puVar2[1];
          *(undefined8 *)pOVar11 = *puVar2;
          *(undefined8 *)(pOVar11 + 2) = uVar3;
          lVar22 = lVar22 + 0x20;
          pOVar11 = pOVar11 + stride;
        } while (uVar9 << 5 != lVar22);
      }
    }
    else if (0 < nb_cols && 1 < (int)uVar8) {
      pOVar21 = dwt->mem;
      piVar14 = tiledp_col + stride;
      iVar13 = 0;
      do {
        iVar6 = tiledp_col[lVar22 * stride];
        iVar18 = *tiledp_col - (iVar6 + 1 >> 1);
        if ((int)uVar8 < 4) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          piVar7 = piVar14;
          iVar10 = iVar6;
          iVar17 = iVar18;
          iVar5 = iVar19;
          do {
            iVar5 = iVar5 + 1;
            iVar6 = tiledp_col[(long)iVar5 * stride];
            iVar18 = *piVar7 - (iVar6 + iVar10 + 2 >> 2);
            pOVar21[uVar15] = iVar17;
            pOVar21[uVar15 + 1] = (iVar17 + iVar18 >> 1) + iVar10;
            uVar15 = uVar15 + 2;
            piVar7 = piVar7 + stride;
            iVar10 = iVar6;
            iVar17 = iVar18;
          } while ((ulong)(uVar8 - 4 & 0xfffffffe) + 2 != uVar15);
          uVar15 = uVar15 & 0xffffffff;
        }
        pOVar21[uVar15] = iVar18;
        lVar16 = uVar9 - 1;
        if ((uVar8 & 1) != 0) {
          iVar5 = tiledp_col[(uVar8 - 1 >> 1) * stride] - (iVar6 + 1 >> 1);
          pOVar21[uVar8 - 1] = iVar5;
          iVar18 = iVar5 + iVar18 >> 1;
          lVar16 = uVar9 - 2;
        }
        pOVar21[lVar16] = iVar18 + iVar6;
        uVar15 = 0;
        piVar7 = tiledp_col;
        do {
          *piVar7 = pOVar21[uVar15];
          uVar15 = uVar15 + 1;
          piVar7 = piVar7 + stride;
        } while (uVar9 != uVar15);
        iVar13 = iVar13 + 1;
        tiledp_col = tiledp_col + 1;
        piVar14 = piVar14 + 1;
      } while (iVar13 != nb_cols);
    }
  }
  else if (uVar8 == 2) {
    if (0 < nb_cols) {
      pOVar21 = dwt->mem;
      iVar19 = 0;
      do {
        iVar13 = *tiledp_col - (tiledp_col[lVar22 * stride] + 1 >> 1);
        pOVar21[1] = iVar13;
        *pOVar21 = iVar13 + tiledp_col[lVar22 * stride];
        lVar16 = 0;
        piVar14 = tiledp_col;
        do {
          *piVar14 = pOVar21[lVar16];
          lVar16 = lVar16 + 1;
          piVar14 = piVar14 + stride;
        } while (lVar16 == 1);
        iVar19 = iVar19 + 1;
        tiledp_col = tiledp_col + 1;
      } while (iVar19 != nb_cols);
    }
  }
  else if (uVar8 == 1) {
    if (0 < nb_cols) {
      lVar22 = 0;
      do {
        tiledp_col[lVar22] = tiledp_col[lVar22] / 2;
        lVar22 = lVar22 + 1;
      } while (nb_cols != (int)lVar22);
    }
  }
  else if (nb_cols == 8 && 2 < (int)uVar8) {
    pOVar21 = dwt->mem;
    if (((ulong)pOVar21 & 0xf) != 0) {
      __assert_fail("(OPJ_SIZE_T)tmp % (sizeof(OPJ_INT32) * VREG_INT_COUNT) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/dwt.c"
                    ,0x303,
                    "void opj_idwt53_v_cas1_mcols_SSE2_OR_AVX2(OPJ_INT32 *, const OPJ_INT32, const OPJ_INT32, OPJ_INT32 *, const OPJ_SIZE_T)"
                   );
    }
    piVar14 = tiledp_col + lVar22 * stride;
    piVar7 = piVar14 + stride;
    iVar19 = *piVar7;
    iVar13 = piVar7[1];
    iVar6 = piVar7[2];
    iVar18 = piVar7[3];
    iVar5 = piVar14[1];
    iVar10 = piVar14[2];
    iVar17 = piVar14[3];
    iVar28 = *tiledp_col - (iVar19 + *piVar14 + 2 >> 2);
    iVar29 = tiledp_col[1] - (iVar13 + iVar5 + 2 >> 2);
    iVar30 = tiledp_col[2] - (iVar6 + iVar10 + 2 >> 2);
    iVar31 = tiledp_col[3] - (iVar18 + iVar17 + 2 >> 2);
    *pOVar21 = *piVar14 + iVar28;
    pOVar21[1] = iVar5 + iVar29;
    pOVar21[2] = iVar10 + iVar30;
    pOVar21[3] = iVar17 + iVar31;
    piVar7 = piVar14 + stride + 4;
    iVar5 = *piVar7;
    iVar10 = piVar7[1];
    iVar17 = piVar7[2];
    iVar32 = piVar7[3];
    iVar41 = piVar14[5];
    iVar42 = piVar14[6];
    iVar43 = piVar14[7];
    iVar33 = tiledp_col[4] - (iVar5 + piVar14[4] + 2 >> 2);
    iVar35 = tiledp_col[5] - (iVar10 + iVar41 + 2 >> 2);
    iVar37 = tiledp_col[6] - (iVar17 + iVar42 + 2 >> 2);
    iVar39 = tiledp_col[7] - (iVar32 + iVar43 + 2 >> 2);
    pOVar21[4] = piVar14[4] + iVar33;
    pOVar21[5] = iVar41 + iVar35;
    pOVar21[6] = iVar42 + iVar37;
    pOVar21[7] = iVar43 + iVar39;
    uVar4 = uVar8 & 1 ^ 1;
    uVar15 = 8;
    if (1 < (int)((uVar8 - 2) - uVar4)) {
      lVar22 = (lVar22 * 4 + 8) * stride;
      lVar23 = 4;
      lVar16 = 0;
      lVar20 = 0x1000000000;
      iVar41 = iVar19;
      iVar42 = iVar13;
      iVar43 = iVar6;
      iVar44 = iVar18;
      iVar45 = iVar5;
      iVar46 = iVar10;
      iVar47 = iVar17;
      iVar48 = iVar32;
      iVar24 = iVar28;
      iVar25 = iVar29;
      iVar26 = iVar30;
      iVar27 = iVar31;
      iVar34 = iVar33;
      iVar36 = iVar35;
      iVar38 = iVar37;
      iVar40 = iVar39;
      do {
        piVar14 = (int *)((long)tiledp_col + lVar23 * 4 + lVar22 + -0x10);
        iVar19 = *piVar14;
        iVar13 = piVar14[1];
        iVar6 = piVar14[2];
        iVar18 = piVar14[3];
        piVar14 = (int *)((long)tiledp_col + lVar23 * 4 + lVar22);
        iVar5 = *piVar14;
        iVar10 = piVar14[1];
        iVar17 = piVar14[2];
        iVar32 = piVar14[3];
        piVar14 = tiledp_col + stride + lVar23 + -4;
        iVar28 = *piVar14 - (iVar41 + iVar19 + 2 >> 2);
        iVar29 = piVar14[1] - (iVar42 + iVar13 + 2 >> 2);
        iVar30 = piVar14[2] - (iVar43 + iVar6 + 2 >> 2);
        iVar31 = piVar14[3] - (iVar44 + iVar18 + 2 >> 2);
        piVar14 = tiledp_col + stride + lVar23;
        iVar33 = *piVar14 - (iVar45 + iVar5 + 2 >> 2);
        iVar35 = piVar14[1] - (iVar46 + iVar10 + 2 >> 2);
        iVar37 = piVar14[2] - (iVar47 + iVar17 + 2 >> 2);
        iVar39 = piVar14[3] - (iVar48 + iVar32 + 2 >> 2);
        pOVar11 = pOVar21 + lVar16 + 8;
        *pOVar11 = iVar24;
        pOVar11[1] = iVar25;
        pOVar11[2] = iVar26;
        pOVar11[3] = iVar27;
        pOVar11 = pOVar21 + lVar16 + 0xc;
        *pOVar11 = iVar34;
        pOVar11[1] = iVar36;
        pOVar11[2] = iVar38;
        pOVar11[3] = iVar40;
        piVar14 = (int *)((long)pOVar21 + (lVar20 >> 0x1e));
        *piVar14 = (iVar24 + iVar28 >> 1) + iVar41;
        piVar14[1] = (iVar25 + iVar29 >> 1) + iVar42;
        piVar14[2] = (iVar26 + iVar30 >> 1) + iVar43;
        piVar14[3] = (iVar27 + iVar31 >> 1) + iVar44;
        piVar14 = (int *)((long)pOVar21 + (lVar20 >> 0x1e) + 0x10);
        *piVar14 = (iVar34 + iVar33 >> 1) + iVar45;
        piVar14[1] = (iVar36 + iVar35 >> 1) + iVar46;
        piVar14[2] = (iVar38 + iVar37 >> 1) + iVar47;
        piVar14[3] = (iVar40 + iVar39 >> 1) + iVar48;
        lVar20 = lVar20 + 0x1000000000;
        lVar16 = lVar16 + 0x10;
        lVar23 = lVar23 + stride;
        iVar41 = iVar19;
        iVar42 = iVar13;
        iVar43 = iVar6;
        iVar44 = iVar18;
        iVar45 = iVar5;
        iVar46 = iVar10;
        iVar47 = iVar17;
        iVar48 = iVar32;
        iVar24 = iVar28;
        iVar25 = iVar29;
        iVar26 = iVar30;
        iVar27 = iVar31;
        iVar34 = iVar33;
        iVar36 = iVar35;
        iVar38 = iVar37;
        iVar40 = iVar39;
      } while ((ulong)((uVar8 - uVar4) - 4 >> 1) * 0x10 + 0x10 != lVar16);
      uVar15 = (ulong)((int)lVar16 + 8);
    }
    pOVar11 = pOVar21 + uVar15;
    *pOVar11 = iVar28;
    pOVar11[1] = iVar29;
    pOVar11[2] = iVar30;
    pOVar11[3] = iVar31;
    pOVar11 = pOVar21 + uVar15 + 4;
    *pOVar11 = iVar33;
    pOVar11[1] = iVar35;
    pOVar11[2] = iVar37;
    pOVar11[3] = iVar39;
    if ((uVar8 & 1) == 0) {
      lVar22 = ((uVar8 >> 1) - 1) * stride;
      piVar14 = tiledp_col + lVar22;
      iVar45 = *piVar14 - (iVar19 * 2 + 2 >> 2);
      iVar46 = piVar14[1] - (iVar13 * 2 + 2 >> 2);
      iVar47 = piVar14[2] - (iVar6 * 2 + 2 >> 2);
      iVar48 = piVar14[3] - (iVar18 * 2 + 2 >> 2);
      piVar14 = tiledp_col + lVar22 + 4;
      iVar41 = *piVar14 - (iVar5 * 2 + 2 >> 2);
      iVar42 = piVar14[1] - (iVar10 * 2 + 2 >> 2);
      iVar43 = piVar14[2] - (iVar17 * 2 + 2 >> 2);
      iVar44 = piVar14[3] - (iVar32 * 2 + 2 >> 2);
      uVar15 = (ulong)((uVar8 - 2) * 8);
      pOVar11 = pOVar21 + uVar15;
      *pOVar11 = (iVar28 + iVar45 >> 1) + iVar19;
      pOVar11[1] = (iVar29 + iVar46 >> 1) + iVar13;
      pOVar11[2] = (iVar30 + iVar47 >> 1) + iVar6;
      pOVar11[3] = (iVar31 + iVar48 >> 1) + iVar18;
      pOVar11 = pOVar21 + uVar15 + 4;
      *pOVar11 = (iVar33 + iVar41 >> 1) + iVar5;
      pOVar11[1] = (iVar35 + iVar42 >> 1) + iVar10;
      pOVar11[2] = (iVar37 + iVar43 >> 1) + iVar17;
      pOVar11[3] = (iVar39 + iVar44 >> 1) + iVar32;
      uVar15 = (ulong)(uVar8 * 8 - 8);
      pOVar11 = pOVar21 + uVar15;
      *pOVar11 = iVar45;
      pOVar11[1] = iVar46;
      pOVar11[2] = iVar47;
      pOVar11[3] = iVar48;
      pOVar11 = pOVar21 + uVar15 + 4;
      *pOVar11 = iVar41;
      pOVar11[1] = iVar42;
      pOVar11[2] = iVar43;
      pOVar11[3] = iVar44;
    }
    else {
      pOVar11 = pOVar21 + (long)(int)(uVar8 * 8) + -8;
      *pOVar11 = iVar28 + iVar19;
      pOVar11[1] = iVar29 + iVar13;
      pOVar11[2] = iVar30 + iVar6;
      pOVar11[3] = iVar31 + iVar18;
      pOVar11 = pOVar21 + (long)(int)(uVar8 * 8) + -4;
      *pOVar11 = iVar33 + iVar5;
      pOVar11[1] = iVar35 + iVar10;
      pOVar11[2] = iVar37 + iVar17;
      pOVar11[3] = iVar39 + iVar32;
    }
    if (0 < (int)uVar8) {
      pOVar11 = tiledp_col + 4;
      lVar22 = 0;
      do {
        uVar3 = ((undefined8 *)((long)pOVar21 + lVar22))[1];
        *(undefined8 *)(pOVar11 + -4) = *(undefined8 *)((long)pOVar21 + lVar22);
        *(undefined8 *)(pOVar11 + -2) = uVar3;
        puVar2 = (undefined8 *)((long)pOVar21 + lVar22 + 0x10);
        uVar3 = puVar2[1];
        *(undefined8 *)pOVar11 = *puVar2;
        *(undefined8 *)(pOVar11 + 2) = uVar3;
        lVar22 = lVar22 + 0x20;
        pOVar11 = pOVar11 + stride;
      } while (uVar9 << 5 != lVar22);
    }
  }
  else if (0 < nb_cols && 2 < (int)uVar8) {
    piVar14 = dwt->mem;
    uVar4 = uVar8 & 1 ^ 1;
    pOVar21 = tiledp_col + stride;
    pOVar11 = (OPJ_INT32 *)((lVar22 * 4 + 8) * stride + (long)tiledp_col);
    iVar19 = 0;
    do {
      iVar13 = (tiledp_col + lVar22 * stride)[stride];
      iVar6 = tiledp_col[lVar22 * stride];
      iVar18 = *tiledp_col - (iVar13 + iVar6 + 2 >> 2);
      *piVar14 = iVar6 + iVar18;
      uVar15 = 1;
      if (1 < (int)((uVar8 - 2) - uVar4)) {
        lVar20 = 0;
        lVar16 = 0;
        iVar6 = iVar13;
        iVar5 = iVar18;
        do {
          iVar13 = pOVar11[lVar16];
          iVar18 = pOVar21[lVar16] - (iVar6 + iVar13 + 2 >> 2);
          piVar14[lVar20 + 1] = iVar5;
          piVar14[lVar20 + 2] = (iVar5 + iVar18 >> 1) + iVar6;
          lVar16 = lVar16 + stride;
          lVar20 = lVar20 + 2;
          iVar6 = iVar13;
          iVar5 = iVar18;
        } while ((ulong)((uVar8 - uVar4) - 4 & 0xfffffffe) + 2 != lVar20);
        uVar15 = (ulong)((int)lVar20 + 1);
      }
      piVar14[uVar15] = iVar18;
      if ((uVar8 & 1) == 0) {
        iVar6 = tiledp_col[((uVar8 >> 1) - 1) * stride] - (iVar13 + 1 >> 1);
        piVar14[uVar8 - 2] = (iVar18 + iVar6 >> 1) + iVar13;
        piVar14[uVar9 - 1] = iVar6;
      }
      else {
        piVar14[uVar9 - 1] = iVar18 + iVar13;
      }
      uVar15 = 0;
      piVar7 = tiledp_col;
      do {
        *piVar7 = piVar14[uVar15];
        uVar15 = uVar15 + 1;
        piVar7 = piVar7 + stride;
      } while (uVar9 != uVar15);
      iVar19 = iVar19 + 1;
      tiledp_col = tiledp_col + 1;
      pOVar21 = pOVar21 + 1;
      pOVar11 = pOVar11 + 1;
    } while (iVar19 != nb_cols);
  }
  return;
}

Assistant:

static void opj_idwt53_v(const opj_dwt_t *dwt,
                         OPJ_INT32* tiledp_col,
                         OPJ_SIZE_T stride,
                         OPJ_INT32 nb_cols)
{
#ifdef STANDARD_SLOW_VERSION
    /* For documentation purpose */
    OPJ_INT32 k, c;
    for (c = 0; c < nb_cols; c ++) {
        opj_dwt_interleave_v(dwt, tiledp_col + c, stride);
        opj_dwt_decode_1(dwt);
        for (k = 0; k < dwt->sn + dwt->dn; ++k) {
            tiledp_col[c + k * stride] = dwt->mem[k];
        }
    }
#else
    const OPJ_INT32 sn = dwt->sn;
    const OPJ_INT32 len = sn + dwt->dn;
    if (dwt->cas == 0) {
        /* If len == 1, unmodified value */

#if (defined(__SSE2__) || defined(__AVX2__))
        if (len > 1 && nb_cols == PARALLEL_COLS_53) {
            /* Same as below general case, except that thanks to SSE2/AVX2 */
            /* we can efficiently process 8/16 columns in parallel */
            opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2(dwt->mem, sn, len, tiledp_col, stride);
            return;
        }
#endif
        if (len > 1) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                opj_idwt3_v_cas0(dwt->mem, sn, len, tiledp_col, stride);
            }
            return;
        }
    } else {
        if (len == 1) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                tiledp_col[0] /= 2;
            }
            return;
        }

        if (len == 2) {
            OPJ_INT32 c;
            OPJ_INT32* out = dwt->mem;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                OPJ_INT32 i;
                const OPJ_INT32* in_even = &tiledp_col[(OPJ_SIZE_T)sn * stride];
                const OPJ_INT32* in_odd = &tiledp_col[0];

                out[1] = in_odd[0] - ((in_even[0] + 1) >> 1);
                out[0] = in_even[0] + out[1];

                for (i = 0; i < len; ++i) {
                    tiledp_col[(OPJ_SIZE_T)i * stride] = out[i];
                }
            }

            return;
        }

#if (defined(__SSE2__) || defined(__AVX2__))
        if (len > 2 && nb_cols == PARALLEL_COLS_53) {
            /* Same as below general case, except that thanks to SSE2/AVX2 */
            /* we can efficiently process 8/16 columns in parallel */
            opj_idwt53_v_cas1_mcols_SSE2_OR_AVX2(dwt->mem, sn, len, tiledp_col, stride);
            return;
        }
#endif
        if (len > 2) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                opj_idwt3_v_cas1(dwt->mem, sn, len, tiledp_col, stride);
            }
            return;
        }
    }
#endif
}